

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

int SUNLinSolFree_SPFGMR(SUNLinearSolver S)

{
  int local_1c;
  int k;
  SUNLinearSolver S_local;
  
  if (S != (SUNLinearSolver)0x0) {
    if (*(long *)((long)S->content + 0x80) != 0) {
      N_VDestroy(*(N_Vector *)((long)S->content + 0x80));
    }
    if (*(long *)((long)S->content + 0x90) != 0) {
      N_VDestroy(*(N_Vector *)((long)S->content + 0x90));
    }
    if (*(long *)((long)S->content + 0x60) != 0) {
      N_VDestroyVectorArray(*(N_Vector **)((long)S->content + 0x60),*S->content + 1);
    }
    if (*(long *)((long)S->content + 0x68) != 0) {
      N_VDestroyVectorArray(*(N_Vector **)((long)S->content + 0x68),*S->content + 1);
    }
    if (*(long *)((long)S->content + 0x70) != 0) {
      for (local_1c = 0; local_1c <= *S->content; local_1c = local_1c + 1) {
        if (*(long *)(*(long *)((long)S->content + 0x70) + (long)local_1c * 8) != 0) {
          free(*(void **)(*(long *)((long)S->content + 0x70) + (long)local_1c * 8));
        }
      }
      free(*(void **)((long)S->content + 0x70));
    }
    if (*(long *)((long)S->content + 0x78) != 0) {
      free(*(void **)((long)S->content + 0x78));
    }
    if (*(long *)((long)S->content + 0x88) != 0) {
      free(*(void **)((long)S->content + 0x88));
    }
    if (*(long *)((long)S->content + 0x98) != 0) {
      free(*(void **)((long)S->content + 0x98));
    }
    if (*(long *)((long)S->content + 0xa0) != 0) {
      free(*(void **)((long)S->content + 0xa0));
    }
    free(S->content);
    S->content = (void *)0x0;
    free(S->ops);
    S->ops = (_generic_SUNLinearSolver_Ops *)0x0;
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_SPFGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) return(SUNLS_SUCCESS);

  /* delete items from within the content structure */
  if (SPFGMR_CONTENT(S)->xcor)
    N_VDestroy(SPFGMR_CONTENT(S)->xcor);
  if (SPFGMR_CONTENT(S)->vtemp)
    N_VDestroy(SPFGMR_CONTENT(S)->vtemp);
  if (SPFGMR_CONTENT(S)->V)
    N_VDestroyVectorArray(SPFGMR_CONTENT(S)->V,
                          SPFGMR_CONTENT(S)->maxl+1);
  if (SPFGMR_CONTENT(S)->Z)
    N_VDestroyVectorArray(SPFGMR_CONTENT(S)->Z,
                          SPFGMR_CONTENT(S)->maxl+1);
  if (SPFGMR_CONTENT(S)->Hes) {
    for (k=0; k<=SPFGMR_CONTENT(S)->maxl; k++)
      if (SPFGMR_CONTENT(S)->Hes[k])
        free(SPFGMR_CONTENT(S)->Hes[k]);
    free(SPFGMR_CONTENT(S)->Hes);
  }
  if (SPFGMR_CONTENT(S)->givens)
    free(SPFGMR_CONTENT(S)->givens);
  if (SPFGMR_CONTENT(S)->yg)
    free(SPFGMR_CONTENT(S)->yg);
  if (SPFGMR_CONTENT(S)->cv)
    free(SPFGMR_CONTENT(S)->cv);
  if (SPFGMR_CONTENT(S)->Xv)
    free(SPFGMR_CONTENT(S)->Xv);

  /* delete generic structures */
  free(S->content);  S->content = NULL;
  free(S->ops);  S->ops = NULL;
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}